

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O3

int __thiscall CTPNStmLabel::gen_code_continue(CTPNStmLabel *this,textchar_t *lbl,size_t lbl_len)

{
  CTPNStmEnclosing *pCVar1;
  CTPNStm *pCVar2;
  int iVar3;
  CTcSymLabel *pCVar4;
  
  if (((lbl != (textchar_t *)0x0) && (G_cs->goto_symtab_ != (CTcPrsSymtab *)0x0)) &&
     (pCVar4 = (CTcSymLabel *)
               CTcPrsSymtab::find(G_cs->goto_symtab_,lbl,lbl_len,(CTcPrsSymtab **)0x0),
     pCVar4 == (this->super_CTPNStmLabelBase).lbl_)) {
    pCVar2 = (this->super_CTPNStmLabelBase).stm_;
    if (pCVar2 == (CTPNStm *)0x0) {
      return 0;
    }
    iVar3 = (*(pCVar2->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
              [0x1e])();
    return iVar3;
  }
  pCVar1 = (this->super_CTPNStmLabelBase).super_CTPNStmEnclosing.enclosing_;
  if (pCVar1 == (CTPNStmEnclosing *)0x0) {
    return 0;
  }
  iVar3 = (*(pCVar1->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
            _vptr_CTcPrsNodeBase[0x20])(pCVar1,lbl,lbl_len);
  return iVar3;
}

Assistant:

int CTPNStmLabel::gen_code_continue(const textchar_t *lbl, size_t lbl_len)
{
    /* 
     *   If there's no label, inherit the default handling, since we're
     *   not a default 'continue' target.  If there's a label, and the
     *   label isn't our label, also inherit the default, since the target
     *   lies somewhere else.  
     */
    if (lbl == 0 || G_cs->get_goto_symtab() == 0
        || G_cs->get_goto_symtab()->find(lbl, lbl_len) != lbl_)
        return CTPNStmLabelBase::gen_code_continue(lbl, lbl_len);

    /* 
     *   It's a 'continue' with my label - ask my enclosed statement to do
     *   the work; return failure if I have no enclosed statement.  Note
     *   that we use a special call - generate a *labeled* continue - to
     *   let the statement know that it must perform the 'continue'
     *   itself and cannot defer to enclosing statements.  
     */
    if (stm_ != 0)
        return stm_->gen_code_labeled_continue();
    else
        return FALSE;
}